

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_visuals.cxx
# Opt level: O0

void __thiscall
xray_re::xr_level_visuals::load
          (xr_level_visuals *this,uint32_t xrlc_version,xr_reader *r,xr_level_geom *geom)

{
  xr_reader *local_30;
  xr_reader *s;
  xr_level_geom *geom_local;
  xr_reader *r_local;
  xr_level_visuals *pxStack_10;
  uint32_t xrlc_version_local;
  xr_level_visuals *this_local;
  
  local_30 = (xr_reader *)0x0;
  s = (xr_reader *)geom;
  geom_local = (xr_level_geom *)r;
  r_local._4_4_ = xrlc_version;
  pxStack_10 = this;
  if (xrlc_version < 8) {
    local_30 = xr_reader::open_chunk(r,4);
  }
  else {
    local_30 = xr_reader::open_chunk(r,3);
  }
  if (local_30 != (xr_reader *)0x0) {
    load_ogfs(this,local_30,(xr_level_geom *)s);
    xr_reader::close_chunk((xr_reader *)geom_local,&local_30);
    return;
  }
  __assert_fail("s",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_visuals.cxx"
                ,0x54,
                "void xray_re::xr_level_visuals::load(uint32_t, xr_reader &, const xr_level_geom *)"
               );
}

Assistant:

void xr_level_visuals::load(uint32_t xrlc_version, xr_reader& r, const xr_level_geom* geom)
{
	xr_reader* s = 0;

	if (xrlc_version < XRLC_VERSION_8)
		s = r.open_chunk(FSL5_VISUALS);
	else
		s = r.open_chunk(FSL8_VISUALS);

	xr_assert(s);
	load_ogfs(*s, geom);
	r.close_chunk(s);
}